

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O1

void idx2::DecompressBufZstd(buffer *Input,buffer *Output)

{
  int iVar1;
  long lVar2;
  buffer *dstCapacity;
  buffer *pbVar3;
  unsigned_long_long dstCapacity_00;
  size_t sVar4;
  int iVar5;
  long lVar6;
  buffer *Src;
  byte *dst;
  long Bytes;
  buffer bStack_60;
  buffer *pbStack_40;
  
  dstCapacity = (buffer *)ZSTD_getFrameContentSize(Input->Data,Input->Bytes);
  dst = Output->Data;
  Src = dstCapacity;
  pbVar3 = (buffer *)ZSTD_decompress(dst,(size_t)dstCapacity,Input->Data,Input->Bytes);
  if (pbVar3 != dstCapacity) {
    DecompressBufZstd();
    pbStack_40 = Output;
    dstCapacity_00 = ZSTD_getFrameContentSize(*(void **)dst,*(size_t *)(dst + 8));
    lVar2 = Src->Bytes;
    Bytes = lVar2;
    if (lVar2 <= (long)(dstCapacity_00 + 8)) {
      do {
        lVar6 = (Bytes * 3) / 2;
        Bytes = lVar6 + 8;
      } while (lVar6 <= (long)dstCapacity_00);
    }
    if (Bytes <= lVar2) goto LAB_0017c0b0;
    Bytes = Bytes + 8;
    if (Bytes <= lVar2) goto LAB_0017c0b0;
    if (Mallocator()::Instance == '\0') goto LAB_0017c0da;
    while( true ) {
      bStack_60.Data = (byte *)0x0;
      bStack_60.Bytes = 0;
      bStack_60.Alloc = (allocator *)&Mallocator()::Instance;
      AllocBuf(&bStack_60,Bytes,Src->Alloc);
      iVar1 = *(int *)&Src[1].Alloc + 7;
      iVar5 = *(int *)&Src[1].Alloc + 0xe;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      MemCopy(Src,&bStack_60,(u64)(Src[1].Data + ((long)(iVar5 >> 3) - (long)Src->Data)));
      Src[1].Data = bStack_60.Data + ((long)Src[1].Data - (long)Src->Data);
      DeallocBuf(Src);
      Src->Alloc = bStack_60.Alloc;
      Src->Data = bStack_60.Data;
      Src->Bytes = bStack_60.Bytes;
LAB_0017c0b0:
      sVar4 = ZSTD_decompress(Src->Data,dstCapacity_00,*(void **)dst,*(size_t *)(dst + 8));
      if (sVar4 == dstCapacity_00) break;
      DecompressBufZstd();
LAB_0017c0da:
      DecompressBufZstd();
    }
    return;
  }
  return;
}

Assistant:

void
DecompressBufZstd(const buffer& Input, buffer* Output)
{
  unsigned long long const OutputSize = ZSTD_getFrameContentSize(Input.Data, Size(Input));
  idx2_Assert(Size(*Output) >= (i64)OutputSize);
  size_t const Result = ZSTD_decompress(Output->Data, OutputSize, Input.Data, Size(Input));
  if (Result != OutputSize)
  {
    fprintf(stderr, "Zstd decompression failed\n");
    exit(1);
  }
}